

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr *ppxVar3;
  xmlNodePtr *temp;
  xmlNodePtr n2;
  int i;
  xmlNodeSetPtr set2_local;
  xmlNodeSetPtr set1_local;
  
  n2._4_4_ = 0;
  do {
    if (set2->nodeNr <= n2._4_4_) {
      set2->nodeNr = 0;
      return set1;
    }
    pxVar2 = set2->nodeTab[n2._4_4_];
    if (set1->nodeMax == 0) {
      ppxVar3 = (xmlNodePtr *)(*xmlMalloc)(0x50);
      set1->nodeTab = ppxVar3;
      if (set1->nodeTab == (xmlNodePtr *)0x0) {
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,"merging nodeset\n");
        return (xmlNodeSetPtr)0x0;
      }
      memset(set1->nodeTab,0,0x50);
      set1->nodeMax = 10;
    }
    else if (set1->nodeMax <= set1->nodeNr) {
      if (9999999 < set1->nodeMax) {
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,"merging nodeset hit limit\n");
        return (xmlNodeSetPtr)0x0;
      }
      ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(set1->nodeTab,(long)(set1->nodeMax << 1) << 3);
      if (ppxVar3 == (xmlNodePtr *)0x0) {
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,"merging nodeset\n");
        return (xmlNodeSetPtr)0x0;
      }
      set1->nodeTab = ppxVar3;
      set1->nodeMax = set1->nodeMax << 1;
    }
    iVar1 = set1->nodeNr;
    set1->nodeNr = iVar1 + 1;
    set1->nodeTab[iVar1] = pxVar2;
    n2._4_4_ = n2._4_4_ + 1;
  } while( true );
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    if (set1->nodeMax == 0) {
		set1->nodeTab = (xmlNodePtr *) xmlMalloc(
		    XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
		if (set1->nodeTab == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		memset(set1->nodeTab, 0,
		    XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
		set1->nodeMax = XML_NODESET_DEFAULT;
	    } else if (set1->nodeNr >= set1->nodeMax) {
		xmlNodePtr *temp;

                if (set1->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
                    xmlXPathErrMemory(NULL, "merging nodeset hit limit\n");
                    return(NULL);
                }
		temp = (xmlNodePtr *) xmlRealloc(
		    set1->nodeTab, set1->nodeMax * 2 * sizeof(xmlNodePtr));
		if (temp == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		set1->nodeTab = temp;
		set1->nodeMax *= 2;
	    }
	    set1->nodeTab[set1->nodeNr++] = n2;
	}
    }
    set2->nodeNr = 0;
    return(set1);
}